

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

btScalar btGjkEpaSolver2::SignedDistance
                   (btVector3 *position,btScalar margin,btConvexShape *shape0,btTransform *wtrs0,
                   sResults *results)

{
  bool bVar1;
  long in_RCX;
  btScalar bVar2;
  btScalar bVar3;
  btVector3 bVar4;
  btScalar length_1;
  btVector3 delta_1;
  btScalar length;
  btScalar margin_1;
  btVector3 delta;
  btScalar p;
  U i;
  btVector3 w1;
  btVector3 w0;
  _ gjk_status;
  GJK gjk;
  btTransform wtrs1;
  btSphereShape shape1;
  tShape shape;
  undefined1 in_stack_0000358f;
  sResults *in_stack_00003590;
  btVector3 *in_stack_00003598;
  btTransform *in_stack_000035a0;
  btConvexShape *in_stack_000035a8;
  btTransform *in_stack_000035b0;
  btConvexShape *in_stack_000035b8;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  U in_stack_fffffffffffff9c4;
  undefined1 in_stack_fffffffffffff9c8 [16];
  btConvexShape *this;
  undefined1 in_stack_fffffffffffff9f8 [16];
  undefined8 in_stack_fffffffffffffa40;
  undefined1 withmargins;
  undefined1 in_stack_fffffffffffffa48 [16];
  btTransform *in_stack_fffffffffffffa58;
  btConvexShape *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  btScalar local_558;
  btScalar bStack_554;
  btScalar local_538;
  btScalar bStack_534;
  btScalar local_518;
  btScalar bStack_514;
  btScalar local_4f8;
  btScalar bStack_4f4;
  btVector3 *in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb18 [16];
  btScalar local_4d8;
  btScalar bStack_4d4;
  btScalar local_4b8;
  btScalar bStack_4b4;
  btScalar local_498;
  btScalar bStack_494;
  btVector3 local_450;
  btScalar local_440;
  btScalar bStack_43c;
  undefined8 uStack_438;
  btScalar local_430;
  float local_42c;
  undefined8 local_428;
  undefined8 local_420;
  btScalar local_418;
  btScalar bStack_414;
  undefined8 uStack_410;
  btScalar local_408;
  btScalar bStack_404;
  undefined8 uStack_400;
  btScalar local_3f8;
  btScalar bStack_3f4;
  undefined8 local_3f0;
  btScalar local_3e8;
  btScalar bStack_3e4;
  undefined8 local_3e0;
  btVector3 local_3d8;
  btScalar local_3c8;
  btScalar bStack_3c4;
  undefined8 local_3c0;
  btVector3 local_3b8;
  undefined4 local_3a8;
  uint local_3a4;
  btScalar local_3a0;
  btScalar local_39c;
  btScalar local_398;
  btVector3 local_394;
  btScalar local_384;
  btScalar local_380;
  btScalar local_37c;
  btVector3 local_378;
  btScalar local_368;
  btScalar local_364;
  btScalar local_360;
  btVector3 local_35c;
  _ local_34c;
  long local_188;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  long local_30;
  float local_4;
  
  withmargins = (undefined1)((ulong)in_stack_fffffffffffffa40 >> 0x38);
  local_30 = in_RCX;
  gjkepa2_impl::MinkowskiDiff::MinkowskiDiff
            ((MinkowskiDiff *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
  btSphereShape::btSphereShape(in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._4_4_);
  local_15c = 0;
  local_160 = 0;
  local_164 = 0;
  local_168 = 0x3f800000;
  btQuaternion::btQuaternion
            (in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_,
             (btScalar *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
             (btScalar *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
             (btScalar *)0x1e535c);
  btTransform::btTransform
            (in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_,
             (btVector3 *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
  uVar5 = 0;
  gjkepa2_impl::Initialize
            ((btConvexShape *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (btTransform *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa48._8_8_,
             in_stack_fffffffffffffa48._0_8_,(bool)withmargins);
  gjkepa2_impl::GJK::GJK(in_stack_fffffffffffff9c8._8_8_);
  local_360 = 1.0;
  local_364 = 1.0;
  local_368 = 1.0;
  btVector3::btVector3(&local_35c,&local_360,&local_364,&local_368);
  local_34c = gjkepa2_impl::GJK::Evaluate
                        (in_stack_fffffffffffffb18._8_8_,in_stack_fffffffffffffb18._0_8_,
                         in_stack_fffffffffffffb10);
  if (local_34c == Valid) {
    local_37c = 0.0;
    local_380 = 0.0;
    local_384 = 0.0;
    btVector3::btVector3(&local_378,&local_37c,&local_380,&local_384);
    local_398 = 0.0;
    local_39c = 0.0;
    local_3a0 = 0.0;
    btVector3::btVector3(&local_394,&local_398,&local_39c,&local_3a0);
    for (local_3a4 = 0; this = in_stack_fffffffffffff9f8._0_8_,
        local_3a4 < *(uint *)(local_188 + 0x30); local_3a4 = local_3a4 + 1) {
      local_3a8 = *(undefined4 *)(local_188 + 0x20 + (ulong)local_3a4 * 4);
      bVar4 = gjkepa2_impl::MinkowskiDiff::Support
                        (in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_,
                         in_stack_fffffffffffff9c4);
      local_3c0 = bVar4.m_floats._8_8_;
      local_498 = bVar4.m_floats[0];
      bStack_494 = bVar4.m_floats[1];
      local_3c8 = local_498;
      bStack_3c4 = bStack_494;
      bVar4 = ::operator*(in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_);
      local_3b8.m_floats._8_8_ = bVar4.m_floats._8_8_;
      local_4b8 = bVar4.m_floats[0];
      bStack_4b4 = bVar4.m_floats[1];
      local_3b8.m_floats[0] = local_4b8;
      local_3b8.m_floats[1] = bStack_4b4;
      btVector3::operator+=(&local_378,&local_3b8);
      bVar4 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3f0 = bVar4.m_floats._8_8_;
      local_4d8 = bVar4.m_floats[0];
      bStack_4d4 = bVar4.m_floats[1];
      local_3f8 = local_4d8;
      bStack_3f4 = bStack_4d4;
      bVar4 = gjkepa2_impl::MinkowskiDiff::Support
                        (in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_,
                         in_stack_fffffffffffff9c4);
      local_3e0 = bVar4.m_floats._8_8_;
      local_4f8 = bVar4.m_floats[0];
      bStack_4f4 = bVar4.m_floats[1];
      local_3e8 = local_4f8;
      bStack_3e4 = bStack_4f4;
      bVar4 = ::operator*(in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_);
      local_3d8.m_floats._8_8_ = bVar4.m_floats._8_8_;
      local_518 = bVar4.m_floats[0];
      bStack_514 = bVar4.m_floats[1];
      local_3d8.m_floats[0] = local_518;
      local_3d8.m_floats[1] = bStack_514;
      btVector3::operator+=(&local_394,&local_3d8);
    }
    bVar4 = btTransform::operator*
                      ((btTransform *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffff9bc,uVar5));
    uStack_400 = bVar4.m_floats._8_8_;
    local_538 = bVar4.m_floats[0];
    bStack_534 = bVar4.m_floats[1];
    local_408 = local_538;
    bStack_404 = bStack_534;
    *(long *)(local_30 + 4) = bVar4.m_floats._0_8_;
    *(undefined8 *)(local_30 + 0xc) = uStack_400;
    bVar4 = btTransform::operator*
                      ((btTransform *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffff9bc,uVar5));
    uStack_410 = bVar4.m_floats._8_8_;
    local_558 = bVar4.m_floats[0];
    bStack_554 = bVar4.m_floats[1];
    local_418 = local_558;
    bStack_414 = bStack_554;
    *(long *)(local_30 + 0x14) = bVar4.m_floats._0_8_;
    *(undefined8 *)(local_30 + 0x1c) = uStack_410;
    bVar4 = operator-(in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_);
    local_428 = bVar4.m_floats._0_8_;
    local_420 = bVar4.m_floats._8_8_;
    bVar2 = btConvexShape::getMarginNonVirtual(this);
    bVar3 = btConvexShape::getMarginNonVirtual(this);
    local_42c = bVar2 + bVar3;
    local_430 = btVector3::length((btVector3 *)0x1e5877);
    bVar4 = operator/((btVector3 *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                      (btScalar *)CONCAT44(in_stack_fffffffffffff9bc,uVar5));
    uStack_438 = bVar4.m_floats._8_8_;
    local_440 = bVar4.m_floats[0];
    bStack_43c = bVar4.m_floats[1];
    *(long *)(local_30 + 0x24) = bVar4.m_floats._0_8_;
    *(undefined8 *)(local_30 + 0x2c) = uStack_438;
    bVar4 = ::operator*(in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_);
    local_450.m_floats._0_8_ = bVar4.m_floats._0_8_;
    local_450.m_floats._8_8_ = bVar4.m_floats._8_8_;
    btVector3::operator+=((btVector3 *)(local_30 + 4),&local_450);
    local_4 = local_430 - local_42c;
  }
  else {
    if (local_34c == Inside) {
      uVar5 = 1;
      bVar1 = Penetration(in_stack_000035b8,in_stack_000035b0,in_stack_000035a8,in_stack_000035a0,
                          in_stack_00003598,in_stack_00003590,(bool)in_stack_0000358f);
      if (bVar1) {
        operator-(in_stack_fffffffffffff9c8._8_8_,in_stack_fffffffffffff9c8._0_8_);
        bVar2 = btVector3::length((btVector3 *)0x1e5a2a);
        if (1.1920929e-07 <= bVar2) {
          bVar4 = operator/((btVector3 *)
                            CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                            (btScalar *)CONCAT44(in_stack_fffffffffffff9bc,uVar5));
          *(long *)(local_30 + 0x24) = bVar4.m_floats._0_8_;
          *(long *)(local_30 + 0x2c) = bVar4.m_floats._8_8_;
        }
        local_4 = -bVar2;
        goto LAB_001e5b00;
      }
    }
    local_4 = 3.4028235e+38;
  }
LAB_001e5b00:
  btSphereShape::~btSphereShape((btSphereShape *)0x1e5b0d);
  return local_4;
}

Assistant:

btScalar	btGjkEpaSolver2::SignedDistance(const btVector3& position,
											btScalar margin,
											const btConvexShape* shape0,
											const btTransform& wtrs0,
											sResults& results)
{
	tShape			shape;
	btSphereShape	shape1(margin);
	btTransform		wtrs1(btQuaternion(0,0,0,1),position);
	Initialize(shape0,wtrs0,&shape1,wtrs1,results,shape,false);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,btVector3(1,1,1));
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		const btVector3	delta=	results.witnesses[1]-
			results.witnesses[0];
		const btScalar	margin=	shape0->getMarginNonVirtual()+
			shape1.getMarginNonVirtual();
		const btScalar	length=	delta.length();	
		results.normal			=	delta/length;
		results.witnesses[0]	+=	results.normal*margin;
		return(length-margin);
	}
	else
	{
		if(gjk_status==GJK::eStatus::Inside)
		{
			if(Penetration(shape0,wtrs0,&shape1,wtrs1,gjk.m_ray,results))
			{
				const btVector3	delta=	results.witnesses[0]-
					results.witnesses[1];
				const btScalar	length=	delta.length();
				if (length >= SIMD_EPSILON)
					results.normal	=	delta/length;			
				return(-length);
			}
		}	
	}
	return(SIMD_INFINITY);
}